

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SstReader.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::SstReader::DoGetDeferred
          (SstReader *this,Variable<unsigned_long> *variable,uint64_t *data)

{
  void *pvVar1;
  size_t *in_RDX;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  SstStream in_RDI;
  size_t DimCount;
  size_t *Count;
  size_t *Start;
  bool in_stack_00000117;
  void *in_stack_00000118;
  VariableBase *in_stack_00000120;
  BP5Deserializer *in_stack_00000128;
  unsigned_long *in_stack_000004a0;
  Variable<unsigned_long> *in_stack_000004a8;
  BP3Deserializer *in_stack_000004b0;
  value_type *in_stack_fffffffffffffed8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffee0;
  allocator *in_stack_fffffffffffffee8;
  int BlockID;
  allocator *in_stack_fffffffffffffef0;
  allocator *in_stack_fffffffffffffef8;
  allocator *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff19;
  string *in_stack_ffffffffffffff20;
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [39];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [32];
  size_t *local_18;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (((in_RDI->Stats).PreloadBytesReceived & 0x100000000) == 0) {
    in_stack_ffffffffffffff00 = &local_39;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Engine",in_stack_ffffffffffffff00);
    in_stack_fffffffffffffef8 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"SstReader",in_stack_fffffffffffffef8);
    in_stack_fffffffffffffef0 = &local_99;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_98,"DoGetDeferred",in_stack_fffffffffffffef0);
    in_stack_fffffffffffffee8 = &local_c1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_c0,
               "When using the SST engine in ADIOS2, Get() calls must appear between BeginStep/EndStep pairs"
               ,in_stack_fffffffffffffee8);
    helper::Throw<std::logic_error>
              (in_stack_ffffffffffffff20,
               (string *)CONCAT71(in_stack_ffffffffffffff19,in_stack_ffffffffffffff18),
               in_stack_ffffffffffffff10,(string *)in_RDI,
               (int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    std::__cxx11::string::~string(local_98);
    std::allocator<char>::~allocator((allocator<char> *)&local_99);
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  if ((in_RDI->DataLock).__data.__owner == 0) {
    if (*(int *)&local_10[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right == 0) {
      pvVar1 = (void *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_10[1]._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe76443);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe7645c);
      in_stack_fffffffffffffed8 = (value_type *)(in_RDI->DataLock).__align;
      in_stack_fffffffffffffee0 = local_10;
      std::__cxx11::string::c_str();
      SstFFSGetDeferred(in_RDI,in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                        (size_t)in_stack_fffffffffffffef0,(size_t *)in_stack_fffffffffffffee8,
                        (size_t *)in_stack_fffffffffffffee0,pvVar1);
    }
    else if (*(int *)&local_10[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right == 1) {
      pvVar1 = (void *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_10[2]._M_t._M_impl.super__Rb_tree_header._M_node_count);
      BlockID = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xe76504);
      std::__cxx11::string::c_str();
      SstFFSGetLocalDeferred
                (in_RDI,in_stack_ffffffffffffff00,(char *)in_stack_fffffffffffffef8,
                 (size_t)in_stack_fffffffffffffef0,BlockID,(size_t *)in_stack_fffffffffffffee0,
                 pvVar1);
    }
  }
  if ((in_RDI->DataLock).__data.__owner == 1) {
    if (((ulong)local_10[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right & 0x100000000) ==
        0) {
      adios2::format::BP3Deserializer::InitVariableBlockInfo<unsigned_long>
                (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    }
    else {
      *local_18 = local_10[0xb]._M_t._M_impl.super__Rb_tree_header._M_node_count;
    }
  }
  if ((in_RDI->DataLock).__data.__owner == 2) {
    adios2::format::BP5Deserializer::QueueGet
              (in_stack_00000128,in_stack_00000120,in_stack_00000118,in_stack_00000117);
  }
  return;
}

Assistant:

void SstReader::DoGetStructSync(VariableStruct &variable, void *data)
{
    PERFSTUBS_SCOPED_TIMER("BP5Reader::Get");
    if (m_WriterMarshalMethod != SstMarshalBP5)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "SstReader", "GetStructSync",
            "SST only supports struct transmission when BP5 marshalling is "
            "selected");
    }
    bool need_sync = m_BP5Deserializer->QueueGet(variable, data);
    if (need_sync)
        BP5PerformGets();
}